

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O3

HaI32 __thiscall
HACD::WuColorQuantizer::Bottom(WuColorQuantizer *this,Box *cube,HaU8 dir,HaI32 *mmt)

{
  int iVar1;
  undefined7 in_register_00000011;
  int iVar2;
  int iVar3;
  
  iVar1 = (int)CONCAT71(in_register_00000011,dir);
  if (iVar1 == 0) {
    iVar1 = cube->b0;
    iVar2 = cube->r0 * 0x441;
    iVar3 = cube->r1 * 0x441 + iVar1;
    iVar3 = (mmt[iVar3 + cube->g0 * 0x21] + mmt[cube->g1 * 0x21 + iVar1 + iVar2]) -
            (mmt[cube->g1 * 0x21 + iVar3] + mmt[cube->g0 * 0x21 + iVar1 + iVar2]);
  }
  else {
    if (iVar1 == 1) {
      iVar1 = cube->g0 * 0x21;
      iVar3 = cube->r1 * 0x441 + iVar1;
      iVar1 = cube->r0 * 0x441 + iVar1;
      return (mmt[iVar3 + cube->b0] + mmt[cube->b1 + iVar1]) -
             (mmt[iVar3 + cube->b1] + mmt[iVar1 + cube->b0]);
    }
    iVar3 = 0;
    if (iVar1 == 2) {
      iVar1 = cube->r0 * 0x441;
      iVar3 = cube->g1 * 0x21 + iVar1;
      iVar1 = cube->g0 * 0x21 + iVar1;
      return (mmt[iVar3 + cube->b0] + mmt[cube->b1 + iVar1]) -
             (mmt[iVar3 + cube->b1] + mmt[iVar1 + cube->b0]);
    }
  }
  return iVar3;
}

Assistant:

HaI32 
		WuColorQuantizer::Bottom(Box *cube, HaU8 dir, HaI32 *mmt) {
			switch(dir)
			{
			case FI_RGBA_RED:
				return( - mmt[INDEX(cube->r0, cube->g1, cube->b1)]
				+ mmt[INDEX(cube->r0, cube->g1, cube->b0)]
				+ mmt[INDEX(cube->r0, cube->g0, cube->b1)]
				- mmt[INDEX(cube->r0, cube->g0, cube->b0)] );
				break;
			case FI_RGBA_GREEN:
				return( - mmt[INDEX(cube->r1, cube->g0, cube->b1)]
				+ mmt[INDEX(cube->r1, cube->g0, cube->b0)]
				+ mmt[INDEX(cube->r0, cube->g0, cube->b1)]
				- mmt[INDEX(cube->r0, cube->g0, cube->b0)] );
				break;
			case FI_RGBA_BLUE:
				return( - mmt[INDEX(cube->r1, cube->g1, cube->b0)]
				+ mmt[INDEX(cube->r1, cube->g0, cube->b0)]
				+ mmt[INDEX(cube->r0, cube->g1, cube->b0)]
				- mmt[INDEX(cube->r0, cube->g0, cube->b0)] );
				break;
			}

			return 0;
	}